

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall
wasm::WasmBinaryWriter::writeDebugLocation(WasmBinaryWriter *this,Expression *curr,Function *func)

{
  bool bVar1;
  pointer ppVar2;
  DebugLocation *loc;
  size_type sVar3;
  mapped_type *pmVar4;
  bool local_49;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
  local_38;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
  local_30;
  iterator iter;
  unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
  *debugLocations;
  Function *func_local;
  Expression *curr_local;
  WasmBinaryWriter *this_local;
  
  func_local = (Function *)curr;
  curr_local = (Expression *)this;
  if (this->sourceMap != (ostream *)0x0) {
    iter.
    super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
               )&func->debugLocations;
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
         ::find((unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
                 *)iter.
                   super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                   ._M_cur,(key_type *)&func_local);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
         ::end(iter.
               super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
               ._M_cur);
    bVar1 = std::__detail::operator!=(&local_30,&local_38);
    local_49 = false;
    if (bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false,_false>
                             *)&local_30);
      local_49 = std::optional::operator_cast_to_bool((optional *)&ppVar2->second);
    }
    if (local_49 == false) {
      writeNoDebugLocation(this);
    }
    else {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false,_false>
                             *)&local_30);
      loc = std::optional<wasm::Function::DebugLocation>::operator*(&ppVar2->second);
      writeDebugLocation(this,loc);
    }
  }
  if ((func != (Function *)0x0) &&
     (bVar1 = std::
              unordered_map<wasm::Expression_*,_wasm::BinaryLocations::Span,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>_>
              ::empty(&func->expressionLocations), !bVar1)) {
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
    pmVar4 = std::
             unordered_map<wasm::Expression_*,_wasm::BinaryLocations::Span,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>_>
             ::operator[](&(this->binaryLocations).expressions,(key_type *)&func_local);
    *pmVar4 = (mapped_type)(sVar3 & 0xffffffff);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (&this->binaryLocationTrackedExpressionsForFunc,(value_type *)&func_local);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeDebugLocation(Expression* curr, Function* func) {
  if (sourceMap) {
    auto& debugLocations = func->debugLocations;
    auto iter = debugLocations.find(curr);
    if (iter != debugLocations.end() && iter->second) {
      // There is debug information here, write it out.
      writeDebugLocation(*(iter->second));
    } else {
      // This expression has no debug location.
      writeNoDebugLocation();
    }
  }
  // If this is an instruction in a function, and if the original wasm had
  // binary locations tracked, then track it in the output as well.
  if (func && !func->expressionLocations.empty()) {
    binaryLocations.expressions[curr] =
      BinaryLocations::Span{BinaryLocation(o.size()), 0};
    binaryLocationTrackedExpressionsForFunc.push_back(curr);
  }
}